

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

size_t art_frozen_view(char *buf,size_t maxbytes,art_t *art)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  art_node_t *paVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  
  if (art == (art_t *)0x0 || buf == (char *)0x0) {
    return 0;
  }
  art_init_cleared(art);
  if ((7 < maxbytes) && (art->root = *(art_ref_t *)buf, 0x2f < maxbytes - 8)) {
    uVar1 = *(uint64_t *)(buf + 8);
    uVar2 = *(uint64_t *)(buf + 0x10);
    uVar3 = *(uint64_t *)(buf + 0x18);
    uVar4 = *(uint64_t *)(buf + 0x20);
    uVar5 = *(uint64_t *)(buf + 0x30);
    art->first_free[4] = *(uint64_t *)(buf + 0x28);
    art->first_free[5] = uVar5;
    art->first_free[2] = uVar3;
    art->first_free[3] = uVar4;
    art->first_free[0] = uVar1;
    art->first_free[1] = uVar2;
    uVar1 = *(uint64_t *)(buf + 0x10);
    uVar2 = *(uint64_t *)(buf + 0x18);
    uVar3 = *(uint64_t *)(buf + 0x20);
    uVar4 = *(uint64_t *)(buf + 0x28);
    uVar5 = *(uint64_t *)(buf + 0x30);
    art->capacities[0] = *(uint64_t *)(buf + 8);
    art->capacities[1] = uVar1;
    art->capacities[2] = uVar2;
    art->capacities[3] = uVar3;
    art->capacities[4] = uVar4;
    art->capacities[5] = uVar5;
    paVar7 = (art_node_t *)((ulong)(buf + 0x3f) & 0xfffffffffffffff8);
    uVar6 = (long)paVar7 + (-0x38 - (long)buf);
    uVar9 = (maxbytes - 0x38) - uVar6;
    if (uVar6 <= maxbytes - 0x38) {
      lVar8 = 0;
      do {
        if (lVar8 == 5) {
          return (long)paVar7 - (long)buf;
        }
        if (art->capacities[lVar8 + 1] != 0) {
          uVar6 = art->capacities[lVar8 + 1] * ART_NODE_SIZES[lVar8 + 1];
          bVar10 = uVar9 < uVar6;
          uVar9 = uVar9 - uVar6;
          if (bVar10) {
            return 0;
          }
          art->nodes[lVar8 + 1] = paVar7;
          paVar7 = (art_node_t *)((long)paVar7 + uVar6);
        }
        lVar8 = lVar8 + 1;
      } while( true );
    }
  }
  return 0;
}

Assistant:

size_t art_frozen_view(const char *buf, size_t maxbytes, art_t *art) {
    if (buf == NULL || art == NULL) {
        return 0;
    }
    const char *initial_buf = buf;
    art_init_cleared(art);

    if (maxbytes < sizeof(art->root)) {
        return 0;
    }
    memcpy(&art->root, buf, sizeof(art->root));
    buf += sizeof(art->root);
    maxbytes -= sizeof(art->root);

    if (maxbytes < sizeof(art->capacities)) {
        return 0;
    }
    _Static_assert(sizeof(art->first_free) == sizeof(art->capacities),
                   "first_free is read from capacities");
    memcpy(art->first_free, buf, sizeof(art->capacities));
    memcpy(art->capacities, buf, sizeof(art->capacities));
    buf += sizeof(art->capacities);
    maxbytes -= sizeof(art->capacities);

    // Alignment for leaves. The rest of the nodes are aligned the same way.
    const char *before_align = buf;
    buf = CROARING_ART_ALIGN_BUF(buf, alignof(art_leaf_t));
    if (maxbytes < (size_t)(buf - before_align)) {
        return 0;
    }
    maxbytes -= buf - before_align;

    for (art_typecode_t t = CROARING_ART_MIN_TYPE; t <= CROARING_ART_MAX_TYPE;
         ++t) {
        if (art->capacities[t] > 0) {
            size_t size = art->capacities[t] * ART_NODE_SIZES[t];
            if (maxbytes < size) {
                return 0;
            }
            art->nodes[t] = (char *)buf;
            buf += size;
            maxbytes -= size;
        }
    }
    return buf - initial_buf;
}